

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_open.c
# Opt level: O0

int mpt_connection_open(mpt_connection *con,char *to,mpt_fdmode *mp)

{
  int iVar1;
  size_t sVar2;
  mpt_data_decoder_t dec;
  mpt_data_encoder_t enc;
  mpt_stream s;
  int ret;
  int flg;
  mpt_stream *srm;
  undefined1 local_30 [4];
  mpt_socket tmp;
  mpt_fdmode mode;
  mpt_fdmode *mp_local;
  char *to_local;
  mpt_connection *con_local;
  
  srm._4_4_ = -1;
  _ret = (mpt_buffer *)0x0;
  s._wd._enc._4_4_ = 0;
  if (((con->out).state & 0x10) == 0) {
    if (to == (char *)0x0) {
      con_local._4_4_ = -1;
    }
    else {
      mode = (mpt_fdmode)mp;
      if (mp == (mpt_fdmode *)0x0) {
        s._wd._enc._4_4_ = mpt_mode_parse(local_30,to);
        if (s._wd._enc._4_4_ < 0) {
          return s._wd._enc._4_4_;
        }
        tmp._id._2_2_ = tmp._id._2_2_ | 0x30;
        mode = (mpt_fdmode)local_30;
      }
      s._wd._enc._0_4_ =
           mpt_connect((mpt_socket *)((long)&srm + 4),to + s._wd._enc._4_4_,(mpt_fdmode *)mode);
      if ((int)s._wd._enc < 0) {
        con_local._4_4_ = -2;
      }
      else {
        s._wd._enc._4_4_ = mpt_stream_sockflags((int)s._wd._enc);
        if (-1 < s._wd._enc._4_4_) {
          memset(&enc,0,0x98);
          s._rd._state.data.len = 0xffffffffffffffff;
          sVar2 = mpt_message_encoder(2);
          if ((sVar2 == 0) ||
             (s._rd._state.data.msg = mpt_message_decoder(2), s._rd._state.data.msg == 0)) {
            return -8;
          }
          iVar1 = mpt_stream_dopen((mpt_stream *)&enc,(mpt_socket *)((long)&srm + 4),
                                   (uint)*(ushort *)((long)mode + 6));
          if (iVar1 < 0) {
            close(srm._4_4_);
            return -4;
          }
          s._wd._state.scratch = sVar2;
          _ret = (mpt_buffer *)malloc(0x98);
          if (_ret == (mpt_buffer *)0x0) {
            return -4;
          }
          memcpy(_ret,&enc,0x98);
        }
        mpt_connection_close(con);
        if (_ret == (mpt_buffer *)0x0) {
          (con->out).sock._id = srm._4_4_;
        }
        else {
          (con->out).buf._buf = _ret;
        }
        con_local._4_4_ = (int)s._wd._enc;
      }
    }
  }
  else {
    con_local._4_4_ = -4;
  }
  return con_local._4_4_;
}

Assistant:

extern int mpt_connection_open(MPT_STRUCT(connection) *con, const char *to, const MPT_STRUCT(fdmode) *mp)
{
	MPT_STRUCT(fdmode) mode;
	MPT_STRUCT(socket) tmp = MPT_SOCKET_INIT;
	MPT_STRUCT(stream) *srm = 0;
	int flg = 0, ret;
	
	if (con->out.state & MPT_OUTFLAG(Active)) {
		return MPT_ERROR(BadOperation);
	}
	if (!to) {
		return MPT_ERROR(BadArgument);
	}
	/* get mode from target string */
	if (!mp) {
		if ((flg = mpt_mode_parse(&mode, to)) < 0) {
			return flg;
		}
		mode.stream |= MPT_STREAMFLAG(Buffer);
		mp = &mode;
	}
	/* create new connection */
	if ((ret = mpt_connect(&tmp, to+flg, mp)) < 0) {
		return MPT_ERROR(BadValue);
	}
	if ((flg = mpt_stream_sockflags(ret)) >= 0) {
		static const char encoding = MPT_ENUM(EncodingCobs);
		MPT_STRUCT(stream) s = MPT_STREAM_INIT;
		MPT_TYPE(data_encoder) enc;
		MPT_TYPE(data_decoder) dec;
		
		if (!(enc = mpt_message_encoder(encoding))
		    || !(dec = mpt_message_decoder(encoding))) {
			return MPT_ERROR(BadEncoding);
		}
		if (mpt_stream_dopen(&s, &tmp, mp->stream) < 0) {
			(void) close(tmp._id);
			return MPT_ERROR(BadOperation);
		}
		s._wd._enc = enc;
		s._rd._dec = dec;
		
		if (!(srm = malloc(sizeof(*srm)))) {
			return MPT_ERROR(BadOperation);
		}
		*srm = s;
	}
	/* close old connection */
	mpt_connection_close(con);
	
	/* set new connection parameters */
	if (srm) {
		con->out.buf._buf = (void *) srm;
	} else {
		con->out.sock = tmp;
	}
	return ret;
}